

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_value.cpp
# Opt level: O3

void __thiscall Json::Value::Value(Value *this,char *beginValue,char *endValue)

{
  size_t sVar1;
  char *__dest;
  runtime_error *this_00;
  uint uVar2;
  uint uVar3;
  
  *(ushort *)&this->field_0x8 = (ushort)*(undefined4 *)&this->field_0x8 & 0xfe00 | 0x104;
  this->comments_ = (CommentInfo *)0x0;
  this->start_ = 0;
  this->limit_ = 0;
  uVar2 = (int)endValue - (int)beginValue;
  if (uVar2 == 0xffffffff) {
    sVar1 = strlen(beginValue);
    uVar2 = (uint)sVar1;
  }
  uVar3 = 0x7ffffffe;
  if (uVar2 < 0x7ffffffe) {
    uVar3 = uVar2;
  }
  __dest = (char *)malloc((ulong)(uVar3 + 1));
  if (__dest != (char *)0x0) {
    memcpy(__dest,beginValue,(ulong)uVar3);
    __dest[uVar3] = '\0';
    (this->value_).string_ = __dest;
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error
            (this_00,
             "in Json::Value::duplicateStringValue(): Failed to allocate string value buffer");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Value::Value(const char* beginValue, const char* endValue) {
  initBasic(stringValue, true);
  value_.string_ =
      duplicateStringValue(beginValue, (unsigned int)(endValue - beginValue));
}